

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int i2cZip(uint handle,char *inBuf,uint inLen,char *outBuf,uint outLen)

{
  char *pcVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  uint numSegs;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint numSegs_00;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong local_310;
  pi_i2c_msg_t segs [42];
  
  pFVar3 = _stderr;
  uVar8 = (ulong)handle;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(inLen,inBuf);
    fprintf(pFVar3,"%s %s: handle=%d inBuf=%s outBuf=%08X len=%d\n",myTimeStamp::buf,"i2cZip",uVar8,
            myBuf2Str::str,outBuf,(ulong)outLen);
  }
  if (libInitialised == '\0') {
    uVar10 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cZip_cold_1();
    }
  }
  else if (handle < 0x40) {
    if (i2cInfo[uVar8].state == 2) {
      if (inBuf == (char *)0x0 || inLen == 0) {
        uVar10 = 0xffffffa6;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cZip_cold_3();
        }
      }
      else if (outLen == 0 || outBuf != (char *)0x0) {
        uVar8 = (ulong)i2cInfo[uVar8].addr;
        uVar7 = 1;
        local_310 = 0;
        uVar13 = 0;
        uVar5 = 0;
        uVar10 = 0;
        numSegs_00 = 0;
        uVar9 = 0;
        do {
          pFVar3 = _stderr;
          lVar11 = (long)(int)uVar9;
          if ((4 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
            myTimeStamp();
            fprintf(pFVar3,"%s %s: status=%d inpos=%d inlen=%d cmd=%d addr=%d flags=%x\n",
                    myTimeStamp::buf,"i2cZip",(ulong)uVar5,(ulong)uVar9,(ulong)inLen,
                    (ulong)(uint)(int)inBuf[lVar11],uVar8,local_310);
          }
          uVar12 = lVar11 + 1;
          uVar6 = 1;
          switch(inBuf[lVar11]) {
          case '\0':
            uVar5 = 1;
            uVar13 = 1;
            uVar7 = uVar6;
            break;
          case '\x01':
            uVar7 = 0;
            break;
          case '\x02':
            if (numSegs_00 != 0) {
              uVar5 = i2cSegments(handle,segs,numSegs_00);
              uVar5 = (int)uVar5 >> 0x1f & uVar5;
              uVar13 = uVar5;
            }
            iVar4 = 1;
            goto LAB_00112cc3;
          case '\x03':
            if (numSegs_00 != 0) {
              uVar5 = i2cSegments(handle,segs,numSegs_00);
              uVar5 = (int)uVar5 >> 0x1f & uVar5;
              uVar13 = uVar5;
            }
            iVar4 = 0;
LAB_00112cc3:
            i2cSwitchCombined(iVar4);
            uVar7 = uVar6;
            numSegs_00 = 0;
            break;
          case '\x04':
            uVar8 = 0xffffffff;
            if ((int)uVar9 < (int)((uVar7 | 0xfffffffe) + inLen)) {
              pcVar1 = inBuf + uVar12;
              uVar8 = (ulong)(uint)(int)*pcVar1;
              if ((char)uVar7 == '\0') {
                uVar12 = (ulong)(uVar9 + 3);
                uVar8 = (ulong)(uint)(inBuf[lVar11 + 2] * 0x100 + (int)*pcVar1);
              }
              else {
                uVar12 = (ulong)(uVar9 + 2);
              }
            }
            iVar4 = (int)uVar8;
            goto LAB_00112e11;
          case '\x05':
            local_310 = 0xffffffff;
            if ((int)uVar9 < (int)(inLen - 2)) {
              local_310 = (ulong)(uint)(inBuf[lVar11 + 2] * 0x100 + (int)inBuf[uVar12]);
              uVar12 = (ulong)(uVar9 + 3);
            }
            iVar4 = (int)local_310;
LAB_00112e11:
            uVar5 = uVar13;
            uVar7 = uVar6;
            if (iVar4 < 0) {
              uVar5 = 0xffffff91;
              uVar13 = uVar5;
            }
            break;
          case '\x06':
            iVar4 = -1;
            if ((int)uVar9 < (int)((uVar7 | 0xfffffffe) + inLen)) {
              iVar4 = (int)inBuf[uVar12];
              if (uVar7 == 0) {
                iVar4 = inBuf[lVar11 + 2] * 0x100 + iVar4;
                uVar12 = (ulong)(uVar9 + 3);
              }
              else {
                uVar12 = (ulong)(uVar9 + 2);
              }
            }
            if ((iVar4 < 0) || (uVar9 = iVar4 + uVar10, outLen <= uVar9)) {
              uVar5 = 0xffffff92;
              uVar13 = 0xffffff92;
              uVar7 = uVar6;
            }
            else {
              segs[(int)numSegs_00].addr = (uint16_t)uVar8;
              segs[(int)numSegs_00].flags = (ushort)local_310 | 1;
              segs[(int)numSegs_00].len = (uint16_t)iVar4;
              segs[(int)numSegs_00].buf = (uint8_t *)(outBuf + uVar10);
              numSegs = numSegs_00 + 1;
              bVar2 = 0x28 < (int)numSegs_00;
              uVar7 = uVar6;
              numSegs_00 = numSegs;
              uVar10 = uVar9;
              if (bVar2) {
                uVar5 = i2cSegments(handle,segs,numSegs);
                uVar5 = (int)uVar5 >> 0x1f & uVar5;
                uVar13 = uVar5;
                numSegs_00 = 0;
              }
            }
            break;
          case '\a':
            iVar4 = -1;
            if ((int)uVar9 < (int)((uVar7 | 0xfffffffe) + inLen)) {
              iVar4 = (int)inBuf[uVar12];
              if (uVar7 == 0) {
                iVar4 = inBuf[lVar11 + 2] * 0x100 + iVar4;
                uVar12 = (ulong)(uVar9 + 3);
              }
              else {
                uVar12 = (ulong)(uVar9 + 2);
              }
            }
            if (-1 < iVar4) {
              uVar7 = iVar4 + (int)uVar12;
              if (uVar7 < inLen) {
                segs[(int)numSegs_00].addr = (uint16_t)uVar8;
                segs[(int)numSegs_00].flags = (ushort)local_310 & 0xfffe;
                segs[(int)numSegs_00].len = (uint16_t)iVar4;
                segs[(int)numSegs_00].buf = (uint8_t *)(inBuf + (int)uVar12);
                uVar9 = numSegs_00 + 1;
                if (0x28 < (int)numSegs_00) {
                  uVar5 = i2cSegments(handle,segs,uVar9);
                  uVar5 = (int)uVar5 >> 0x1f & uVar5;
                  uVar9 = 0;
                  uVar13 = uVar5;
                }
                uVar12 = (ulong)uVar7;
                uVar7 = uVar6;
                numSegs_00 = uVar9;
                break;
              }
            }
            uVar5 = 0xffffff93;
            uVar13 = 0xffffff93;
            uVar7 = uVar6;
            break;
          default:
            uVar5 = 0xffffff91;
            uVar13 = 0xffffff91;
            uVar7 = uVar6;
          }
        } while ((uVar5 == 0) && (uVar9 = (uint)uVar12, uVar9 < inLen));
        if (numSegs_00 != 0 && -1 < (int)uVar5) {
          uVar5 = i2cSegments(handle,segs,numSegs_00);
        }
        if ((int)uVar5 < 0) {
          uVar10 = uVar5;
        }
      }
      else {
        uVar10 = 0xffffffa6;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cZip_cold_4();
        }
      }
    }
    else {
      uVar10 = 0xffffffe7;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        i2cZip_cold_2();
      }
    }
  }
  else {
    uVar10 = 0xffffffe7;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cZip_cold_5();
    }
  }
  return uVar10;
}

Assistant:

int i2cZip(
   unsigned handle,
   char *inBuf, unsigned inLen, char *outBuf, unsigned outLen)
{
   int numSegs, inPos, outPos, status, bytes, flags, addr;
   int esc, setesc;
   pi_i2c_msg_t segs[PI_I2C_RDRW_IOCTL_MAX_MSGS];

   DBG(DBG_USER, "handle=%d inBuf=%s outBuf=%08X len=%d",
      handle, myBuf2Str(inLen, (char *)inBuf), (int)outBuf, outLen);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (!inBuf || !inLen)
      SOFT_ERROR(PI_BAD_POINTER, "input buffer can't be NULL");

   if (!outBuf && outLen)
      SOFT_ERROR(PI_BAD_POINTER, "output buffer can't be NULL");

   numSegs = 0;

   inPos = 0;
   outPos = 0;
   status = 0;

   addr = i2cInfo[handle].addr;
   flags = 0;
   esc = 0;
   setesc = 0;

   while (!status && (inPos < inLen))
   {
      DBG(DBG_INTERNAL, "status=%d inpos=%d inlen=%d cmd=%d addr=%d flags=%x",
         status, inPos, inLen, inBuf[inPos], addr, flags);

      switch (inBuf[inPos++])
      {
         case PI_I2C_END:
            status = 1;
            break;

         case PI_I2C_COMBINED_ON:
            /* Run prior transactions before setting combined flag */
            if (numSegs)
            {
               status = i2cSegments(handle, segs, numSegs);
               if (status >= 0) status = 0; /* continue */
               numSegs = 0;
            }
            i2cSwitchCombined(1);
            break;

         case PI_I2C_COMBINED_OFF:
            /* Run prior transactions before clearing combined flag */
            if (numSegs)
            {
               status = i2cSegments(handle, segs, numSegs);
               if (status >= 0) status = 0; /* continue */
               numSegs = 0;
            }
            i2cSwitchCombined(0);
            break;

         case PI_I2C_ADDR:
            addr = myI2CGetPar(inBuf, &inPos, inLen, &esc);
            if (addr < 0) status = PI_BAD_I2C_CMD;
            break;

         case PI_I2C_FLAGS:
            /* cheat to force two byte flags */
            esc = 1;
            flags = myI2CGetPar(inBuf, &inPos, inLen, &esc);
            if (flags < 0) status = PI_BAD_I2C_CMD;
            break;

         case PI_I2C_ESC:
            setesc = 1;
            break;

         case PI_I2C_READ:

            bytes = myI2CGetPar(inBuf, &inPos, inLen, &esc);

            if (bytes >= 0)
            {
               if ((bytes + outPos) < outLen)
               {
                  segs[numSegs].addr = addr;
                  segs[numSegs].flags = (flags|1);
                  segs[numSegs].len = bytes;
                  segs[numSegs].buf = (uint8_t *)(outBuf + outPos);
                  outPos += bytes;
                  numSegs++;
                  if (numSegs >= PI_I2C_RDRW_IOCTL_MAX_MSGS)
                  {
                     status = i2cSegments(handle, segs, numSegs);
                     if (status >= 0) status = 0; /* continue */
                     numSegs = 0;
                  }
               }
               else status = PI_BAD_I2C_RLEN;
            }
            else status = PI_BAD_I2C_RLEN;
            break;

         case PI_I2C_WRITE:

            bytes = myI2CGetPar(inBuf, &inPos, inLen, &esc);

            if (bytes >= 0)
            {
               if ((bytes + inPos) < inLen)
               {
                  segs[numSegs].addr = addr;
                  segs[numSegs].flags = (flags&0xfffe);
                  segs[numSegs].len = bytes;
                  segs[numSegs].buf = (uint8_t *)(inBuf + inPos);
                  inPos += bytes;
                  numSegs++;
                  if (numSegs >= PI_I2C_RDRW_IOCTL_MAX_MSGS)
                  {
                     status = i2cSegments(handle, segs, numSegs);
                     if (status >= 0) status = 0; /* continue */
                     numSegs = 0;
                  }
               }
               else status = PI_BAD_I2C_WLEN;
            }
            else status = PI_BAD_I2C_WLEN;
            break;

         default:
            status = PI_BAD_I2C_CMD;
      }

      if (setesc) esc = 1; else esc = 0;

      setesc = 0;
   }

   if (status >= 0)
   {
      if (numSegs) status = i2cSegments(handle, segs, numSegs);
   }

   if (status >= 0) status = outPos;

   return status;
}